

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void AppendDictionary<char[6]>(cmXMLWriter *xml,char *key,char (*value) [6])

{
  char *pcVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char (*local_20) [6];
  char (*value_local) [6];
  char *key_local;
  cmXMLWriter *xml_local;
  
  local_20 = value;
  value_local = (char (*) [6])key;
  key_local = (char *)xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dictionary",&local_41);
  cmXMLWriter::StartElement(xml,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pcVar1 = key_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"key",&local_79);
  cmXMLWriter::Element<char_const*>((cmXMLWriter *)pcVar1,&local_78,(char **)&value_local);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pcVar1 = key_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"value",&local_a1);
  cmXMLWriter::Element<char[6]>((cmXMLWriter *)pcVar1,&local_a0,local_20);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  cmXMLWriter::EndElement((cmXMLWriter *)key_local);
  return;
}

Assistant:

void AppendDictionary(cmXMLWriter& xml, const char* key, T const& value)
{
  xml.StartElement("dictionary");
  xml.Element("key", key);
  xml.Element("value", value);
  xml.EndElement();
}